

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

void __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::GenericDocument(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                  *this,MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator,size_t stackCapacity
                 ,CrtAllocator *stackAllocator)

{
  Number this_00;
  CrtAllocator *in_RCX;
  size_t in_RDX;
  Number in_RSI;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_RDI;
  
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue(in_RDI);
  in_RDI[1].data_.n = in_RSI;
  in_RDI[1].data_.s.str = (Ch *)0x0;
  internal::Stack<rapidjson::CrtAllocator>::Stack
            ((Stack<rapidjson::CrtAllocator> *)(in_RDI + 2),in_RCX,in_RDX);
  ParseResult::ParseResult((ParseResult *)(in_RDI + 5));
  if (in_RDI[1].data_.n.i64 == 0) {
    this_00 = (Number)operator_new(0x28);
    MemoryPoolAllocator<rapidjson::CrtAllocator>::MemoryPoolAllocator
              ((MemoryPoolAllocator<rapidjson::CrtAllocator> *)this_00,0x10000,(CrtAllocator *)0x0);
    in_RDI[1].data_.n = this_00;
    in_RDI[1].data_.o.members = (Member *)this_00;
  }
  return;
}

Assistant:

GenericDocument(Allocator* allocator = 0, size_t stackCapacity = kDefaultStackCapacity, StackAllocator* stackAllocator = 0) : 
        allocator_(allocator), ownAllocator_(0), stack_(stackAllocator, stackCapacity), parseResult_()
    {
        if (!allocator_)
            ownAllocator_ = allocator_ = RAPIDJSON_NEW(Allocator());
    }